

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O3

void __thiscall
ktx::CommandCompare::compareDFDBasic
          (CommandCompare *this,PrintDiff *diff,uint32_t blockIndex,optional<ktx::BDFD> *bdfds,
          optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_> *bdfdSamples)

{
  undefined8 *puVar1;
  optional<ktx::SampleType> *poVar2;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  long *plVar6;
  void *pvVar7;
  code *pcVar8;
  bool abVar9 [4];
  undefined4 uVar10;
  _Alloc_hider _Var11;
  string *psVar12;
  pointer pcVar13;
  optional<ktx::SampleType> *poVar14;
  bool *pbVar15;
  uint uVar16;
  _Optional_payload_base<unsigned_int> _Var17;
  optional<unsigned_int> *poVar18;
  optional<ktx::BDFD> *poVar19;
  long lVar20;
  _Alloc_hider _Var21;
  _Optional_payload_base<unsigned_int> __return_storage_ptr__;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar22;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar23;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  value1;
  optional<std::__cxx11::string> *this_00;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  string_view fmt_10;
  string_view fmt_11;
  string_view fmt_12;
  string_view fmt_13;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  format_args args_11;
  format_args args_12;
  format_args args_13;
  string_view textHeaderIn;
  string_view textHeaderIn_00;
  string_view textHeaderIn_01;
  string_view textHeaderIn_02;
  string_view jsonPathIn;
  string_view jsonPathIn_00;
  string_view jsonPathIn_01;
  string_view jsonPathIn_02;
  _Storage<int,_true> local_1a8;
  char cStack_1a4;
  char cStack_1a3;
  char cStack_1a2;
  char cStack_1a1;
  char cStack_1a0;
  char cStack_19f;
  char cStack_19e;
  char cStack_19d;
  char cStack_19c;
  char cStack_19b;
  char cStack_19a;
  char cStack_199;
  bool local_198 [4];
  undefined4 uStack_194;
  optional<ktx::SampleType> samples [2];
  optional<ktx::BDFD> *bdfds_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  lengthAndOffset [2];
  _Alloc_hider local_100;
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e8;
  _Alloc_hider local_d8;
  undefined1 local_d0 [9];
  _Storage<std::array<unsigned_char,_8UL>,_true> _Stack_c7;
  undefined1 uStack_bf;
  undefined1 uStack_be;
  undefined1 uStack_bd;
  _Storage<std::array<unsigned_int,_4UL>,_true> _Stack_bc;
  bool local_ac;
  undefined1 uStack_ab;
  undefined1 uStack_aa;
  undefined1 uStack_a9;
  bool local_a8;
  _Storage<int,_true> local_9c;
  char cStack_98;
  char cStack_97;
  char cStack_96;
  char cStack_95;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  char cStack_91;
  char cStack_90;
  char cStack_8f;
  char cStack_8e;
  char cStack_8d;
  bool local_8c;
  undefined3 uStack_8b;
  optional<unsigned_int> qualifierFlags [2];
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint32_t local_58;
  uint32_t local_54;
  uint32_t local_50;
  uint32_t local_4c;
  _Storage<int,_true> local_48;
  undefined1 local_44;
  PrintDiff *local_40;
  pointer local_38;
  
  aVar23.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1a8;
  aVar22.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1a8;
  value1.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1a8;
  bdfds_local = bdfds;
  if (((bdfds->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
       super__Optional_payload_base<ktx::BDFD>._M_engaged ==
       (bdfdSamples->
       super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
       )._M_payload.
       super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
       ._M_engaged) &&
     (bdfds[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::BDFD>._M_engaged ==
      bdfdSamples[1].
      super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
      ._M_engaged)) {
    pcVar13 = (pointer)(ulong)blockIndex;
    if ((this->options).super_OptionsCompare.ignoreDFD != all_except_color_space) {
      fmt.size_ = 2;
      fmt.data_ = (char *)0x25;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)samples;
      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = pcVar13;
      psVar12 = ::fmt::v10::vformat_abi_cxx11_
                          ((string *)lengthAndOffset,(v10 *)"/dataFormatDescriptor/blocks/{}/flags",
                           fmt,args);
      uVar16 = (uint)psVar12;
      bVar24 = (bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
               super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
      if (bVar24) {
        uVar16 = (uint)*(byte *)((long)&(bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>).
                                        _M_payload.super__Optional_payload_base<ktx::BDFD>.
                                        _M_payload + 0xb);
      }
      bVar25 = bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
      poVar19 = bdfds_local;
      if (bVar25) {
        poVar19 = (optional<ktx::BDFD> *)
                  (ulong)*(byte *)((long)&bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>
                                          ._M_payload.super__Optional_payload_base<ktx::BDFD>.
                                          _M_payload + 0xb);
      }
      aStack_e8._M_allocated_capacity = (size_type)"Flags";
      local_f8._8_8_ = 5;
      aStack_e8._8_8_ =
           lengthAndOffset[0].
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_string_length;
      local_d8._M_p =
           (pointer)lengthAndOffset[0].
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._0_8_;
      in_R9._1_7_ = (undefined7)
                    ((ulong)lengthAndOffset[0].
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._8_8_ >> 8);
      in_R9._0_1_ = uVar16 != (uint)poVar19 && bVar24 || bVar24 != bVar25;
      local_d0[4] = bVar24;
      local_d0._0_4_ = uVar16;
      local_d0._5_3_ = 0;
      _Stack_c7._0_7_ =
           (uint7)(((ulong)poVar19 & 0xffffffff) >> 8) | (uint7)(((ulong)bVar25 << 0x20) >> 8);
      local_d0[8] = (undefined1)((ulong)poVar19 & 0xffffffff);
      local_f8._0_8_ = &PTR_value_abi_cxx11__0025bd28;
      _Stack_bc._M_value._M_elems[1] = 0x2635b0;
      _Stack_bc._M_value._M_elems[2] = 0;
      _Stack_c7._M_value._M_elems[7] = in_R9._0_1_;
      PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_f8);
      if ((pointer)lengthAndOffset[0].
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._0_8_ !=
          (pointer)((long)&lengthAndOffset[0].
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload + 0x10)) {
        operator_delete((void *)lengthAndOffset[0].
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._0_8_,
                        lengthAndOffset[0].
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._16_8_ + 1);
      }
    }
    fmt_00.size_ = 2;
    fmt_00.data_ = (char *)0x30;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)samples;
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = pcVar13;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)lengthAndOffset,(v10 *)"/dataFormatDescriptor/blocks/{}/transferFunction",
               fmt_00,args_00);
    cStack_1a4 = (bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
                 super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
    if ((bool)cStack_1a4) {
      local_1a8._M_value._0_1_ =
           *(char *)((long)&(bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
                            super__Optional_payload_base<ktx::BDFD>._M_payload + 10);
      local_1a8._M_value._1_1_ = '\0';
      local_1a8._M_value._2_1_ = '\0';
      local_1a8._M_value._3_1_ = '\0';
    }
    cStack_98 = bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
                super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
    if ((bool)cStack_98) {
      local_9c._M_value._0_1_ =
           *(byte *)((long)&bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
                            super__Optional_payload_base<ktx::BDFD>._M_payload + 10);
      local_9c._M_value._1_1_ = '\0';
      local_9c._M_value._2_1_ = '\0';
      local_9c._M_value._3_1_ = '\0';
    }
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._8_8_ = 0;
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = &bdfds_local;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._4_4_ = 0x13544c;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.lower = 0;
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_engaged = true;
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._17_3_ = 0x1354;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._0_2_ = 0;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._2_1_ = 0;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._3_1_ = 0;
    textHeaderIn._M_str = "Transfer";
    textHeaderIn._M_len = 8;
    jsonPathIn._M_str =
         (char *)lengthAndOffset[0].
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._0_8_;
    jsonPathIn._M_len =
         lengthAndOffset[0].
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length;
    DiffEnum<_khr_df_transfer_e>::DiffEnum
              ((DiffEnum<_khr_df_transfer_e> *)local_f8,textHeaderIn,jsonPathIn,
               (optional<int> *)&local_1a8,(optional<int> *)&local_9c,
               (function<const_char_*(unsigned_long)> *)samples);
    PrintDiff::operator<<(diff,(DiffBase<_khr_df_transfer_e> *)local_f8);
    pcVar8 = (code *)CONCAT17(samples[1].super__Optional_base<ktx::SampleType,_true,_true>.
                              _M_payload.super__Optional_payload_base<ktx::SampleType>._M_payload.
                              _3_1_,CONCAT16(samples[1].
                                             super__Optional_base<ktx::SampleType,_true,_true>.
                                             _M_payload.
                                             super__Optional_payload_base<ktx::SampleType>.
                                             _M_payload._2_1_,
                                             CONCAT24(samples[1].
                                                                                                            
                                                  super__Optional_base<ktx::SampleType,_true,_true>.
                                                  _M_payload.
                                                  super__Optional_payload_base<ktx::SampleType>.
                                                  _M_payload._0_2_,
                                                  samples[0].
                                                  super__Optional_base<ktx::SampleType,_true,_true>.
                                                  _M_payload.
                                                  super__Optional_payload_base<ktx::SampleType>.
                                                  _16_4_)));
    if (pcVar8 != (code *)0x0) {
      (*pcVar8)(samples,samples,3);
    }
    _Var21._M_p = (pointer)((long)&lengthAndOffset[0].
                                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ._M_payload + 0x10);
    if ((pointer)lengthAndOffset[0].
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._0_8_ != _Var21._M_p) {
      operator_delete((void *)lengthAndOffset[0].
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._0_8_,
                      lengthAndOffset[0].
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ + 1);
    }
    fmt_01.size_ = 2;
    fmt_01.data_ = (char *)0x2e;
    args_01.field_1.values_ = aVar23.values_;
    args_01.desc_ = (unsigned_long_long)samples;
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = pcVar13;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)lengthAndOffset,(v10 *)"/dataFormatDescriptor/blocks/{}/colorPrimaries",
               fmt_01,args_01);
    cStack_1a4 = (bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
                 super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
    if ((bool)cStack_1a4) {
      local_1a8._M_value._0_1_ =
           *(char *)((long)&(bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
                            super__Optional_payload_base<ktx::BDFD>._M_payload + 9);
      local_1a8._M_value._1_1_ = '\0';
      local_1a8._M_value._2_1_ = '\0';
      local_1a8._M_value._3_1_ = '\0';
    }
    cStack_98 = bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
                super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
    if ((bool)cStack_98) {
      local_9c._M_value._0_1_ =
           *(byte *)((long)&bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
                            super__Optional_payload_base<ktx::BDFD>._M_payload + 9);
      local_9c._M_value._1_1_ = '\0';
      local_9c._M_value._2_1_ = '\0';
      local_9c._M_value._3_1_ = '\0';
    }
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._8_8_ = 0;
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = &bdfds_local;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._4_4_ = 0x135490;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.lower = 0;
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_engaged = true;
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._17_3_ = 0x1354;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._0_2_ = 0;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._2_1_ = 0;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._3_1_ = 0;
    textHeaderIn_00._M_str = "Primaries";
    textHeaderIn_00._M_len = 9;
    jsonPathIn_00._M_str =
         (char *)lengthAndOffset[0].
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._0_8_;
    jsonPathIn_00._M_len =
         lengthAndOffset[0].
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length;
    DiffEnum<_khr_df_primaries_e>::DiffEnum
              ((DiffEnum<_khr_df_primaries_e> *)local_f8,textHeaderIn_00,jsonPathIn_00,
               (optional<int> *)&local_1a8,(optional<int> *)&local_9c,
               (function<const_char_*(unsigned_long)> *)samples);
    PrintDiff::operator<<(diff,(DiffBase<_khr_df_primaries_e> *)local_f8);
    pcVar8 = (code *)CONCAT17(samples[1].super__Optional_base<ktx::SampleType,_true,_true>.
                              _M_payload.super__Optional_payload_base<ktx::SampleType>._M_payload.
                              _3_1_,CONCAT16(samples[1].
                                             super__Optional_base<ktx::SampleType,_true,_true>.
                                             _M_payload.
                                             super__Optional_payload_base<ktx::SampleType>.
                                             _M_payload._2_1_,
                                             CONCAT24(samples[1].
                                                                                                            
                                                  super__Optional_base<ktx::SampleType,_true,_true>.
                                                  _M_payload.
                                                  super__Optional_payload_base<ktx::SampleType>.
                                                  _M_payload._0_2_,
                                                  samples[0].
                                                  super__Optional_base<ktx::SampleType,_true,_true>.
                                                  _M_payload.
                                                  super__Optional_payload_base<ktx::SampleType>.
                                                  _16_4_)));
    local_100._M_p = pcVar13;
    if (pcVar8 != (code *)0x0) {
      (*pcVar8)(samples,samples,3);
    }
    if ((pointer)lengthAndOffset[0].
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._0_8_ != _Var21._M_p) {
      operator_delete((void *)lengthAndOffset[0].
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._0_8_,
                      lengthAndOffset[0].
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ + 1);
    }
    _Var11._M_p = local_100._M_p;
    if ((this->options).super_OptionsCompare.ignoreDFD != all_except_color_space) {
      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = local_100._M_p;
      fmt_02.size_ = 2;
      fmt_02.data_ = (char *)0x2a;
      args_02.field_1.values_ = aVar22.values_;
      args_02.desc_ = (unsigned_long_long)samples;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)lengthAndOffset,(v10 *)"/dataFormatDescriptor/blocks/{}/colorModel",
                 fmt_02,args_02);
      cStack_1a4 = (bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
                   super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
      if ((bool)cStack_1a4) {
        local_1a8._M_value._0_1_ =
             *(char *)((long)&(bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
                              super__Optional_payload_base<ktx::BDFD>._M_payload + 8);
        local_1a8._M_value._1_1_ = '\0';
        local_1a8._M_value._2_1_ = '\0';
        local_1a8._M_value._3_1_ = '\0';
      }
      cStack_98 = bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
                  super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
      if ((bool)cStack_98) {
        local_9c._M_value._0_1_ =
             *(byte *)((long)&bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
                              super__Optional_payload_base<ktx::BDFD>._M_payload + 8);
        local_9c._M_value._1_1_ = '\0';
        local_9c._M_value._2_1_ = '\0';
        local_9c._M_value._3_1_ = '\0';
      }
      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._8_8_ = 0;
      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = &bdfds_local;
      samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._4_4_ = 0x1354d4;
      samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.lower = 0;
      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_engaged = true;
      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._17_3_ = 0x1354;
      samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._0_2_ = 0;
      samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._2_1_ = 0;
      samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._3_1_ = 0;
      textHeaderIn_01._M_str = "Model";
      textHeaderIn_01._M_len = 5;
      jsonPathIn_01._M_str =
           (char *)lengthAndOffset[0].
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._0_8_;
      jsonPathIn_01._M_len =
           lengthAndOffset[0].
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_string_length;
      DiffEnum<_khr_df_model_e>::DiffEnum
                ((DiffEnum<_khr_df_model_e> *)local_f8,textHeaderIn_01,jsonPathIn_01,
                 (optional<int> *)&local_1a8,(optional<int> *)&local_9c,
                 (function<const_char_*(unsigned_long)> *)samples);
      PrintDiff::operator<<(diff,(DiffBase<_khr_df_model_e> *)local_f8);
      pcVar8 = (code *)CONCAT17(samples[1].super__Optional_base<ktx::SampleType,_true,_true>.
                                _M_payload.super__Optional_payload_base<ktx::SampleType>._M_payload.
                                _3_1_,CONCAT16(samples[1].
                                               super__Optional_base<ktx::SampleType,_true,_true>.
                                               _M_payload.
                                               super__Optional_payload_base<ktx::SampleType>.
                                               _M_payload._2_1_,
                                               CONCAT24(samples[1].
                                                                                                                
                                                  super__Optional_base<ktx::SampleType,_true,_true>.
                                                  _M_payload.
                                                  super__Optional_payload_base<ktx::SampleType>.
                                                  _M_payload._0_2_,
                                                  samples[0].
                                                  super__Optional_base<ktx::SampleType,_true,_true>.
                                                  _M_payload.
                                                  super__Optional_payload_base<ktx::SampleType>.
                                                  _16_4_)));
      if (pcVar8 != (code *)0x0) {
        (*pcVar8)(samples,samples,3);
      }
      if ((pointer)lengthAndOffset[0].
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._0_8_ != _Var21._M_p) {
        operator_delete((void *)lengthAndOffset[0].
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._0_8_,
                        lengthAndOffset[0].
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._16_8_ + 1);
      }
      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = _Var11._M_p;
      fmt_03.size_ = 2;
      fmt_03.data_ = (char *)0x33;
      args_03.field_1.values_ = value1.values_;
      args_03.desc_ = (unsigned_long_long)samples;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)lengthAndOffset,
                 (v10 *)"/dataFormatDescriptor/blocks/{}/texelBlockDimension",fmt_03,args_03);
      uVar10 = samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._16_4_;
      _Stack_c7._M_value._M_elems[7] =
           (bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
           super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
      if ((bool)_Stack_c7._M_value._M_elems[7]) {
        uVar3 = *(undefined8 *)
                 ((long)&(bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
                         super__Optional_payload_base<ktx::BDFD>._M_payload + 8);
        uVar16 = (uint)((ulong)uVar3 >> 0x20);
        samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
        super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ =
             CONCAT44(uVar16 >> 8,uVar16) & 0xff000000ff;
        samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
        super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.upper._1_3_ = 0;
        samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
        super__Optional_payload_base<ktx::SampleType>._M_payload._8_5_ =
             CONCAT14((char)((ulong)uVar3 >> 0x38),(uint)(ushort)((ulong)uVar3 >> 0x30)) &
             0xff000000ff;
      }
      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_engaged =
           (bool)_Stack_c7._M_value._M_elems[7];
      local_ac = bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
                 super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
      if (local_ac) {
        uVar3 = *(undefined8 *)
                 ((long)&bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
                         super__Optional_payload_base<ktx::BDFD>._M_payload + 8);
        value1._0_4_ = (uint)((ulong)uVar3 >> 0x28) & 0xff;
        value1._4_4_ = 0;
        local_1a8._M_value._0_1_ = (undefined1)((ulong)uVar3 >> 0x20);
        local_1a8._M_value._1_1_ = '\0';
        local_1a8._M_value._2_1_ = '\0';
        local_1a8._M_value._3_1_ = '\0';
        cStack_1a4 = (char)((ulong)uVar3 >> 0x28);
        cStack_1a3 = '\0';
        cStack_1a2 = '\0';
        cStack_1a1 = '\0';
        cStack_1a0 = (char)((ulong)uVar3 >> 0x30);
        cStack_19f = '\0';
        cStack_19e = '\0';
        cStack_19d = '\0';
        cStack_19c = (char)((ulong)uVar3 >> 0x38);
        cStack_19b = '\0';
        cStack_19a = '\0';
        cStack_199 = '\0';
      }
      local_198[0] = local_ac;
      abVar9 = local_198;
      aStack_e8._M_allocated_capacity = (size_type)"Dimensions";
      local_f8._8_8_ = 10;
      aStack_e8._8_8_ =
           lengthAndOffset[0].
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_string_length;
      local_d8._M_p =
           (pointer)lengthAndOffset[0].
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._0_8_;
      local_a8 = (bool)_Stack_c7._M_value._M_elems[7] != local_ac;
      if ((bool)_Stack_c7._M_value._M_elems[7] && !local_a8) {
        auVar26[0] = -(local_1a8._M_value._0_1_ ==
                      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                      super__Optional_payload_base<ktx::SampleType>._M_payload._0_1_);
        auVar26[1] = -(local_1a8._M_value._1_1_ ==
                      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                      super__Optional_payload_base<ktx::SampleType>._M_payload._1_1_);
        auVar26[2] = -(local_1a8._M_value._2_1_ ==
                      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                      super__Optional_payload_base<ktx::SampleType>._M_payload._2_1_);
        auVar26[3] = -(local_1a8._M_value._3_1_ ==
                      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                      super__Optional_payload_base<ktx::SampleType>._M_payload._3_1_);
        auVar26[4] = -(cStack_1a4 ==
                      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                      super__Optional_payload_base<ktx::SampleType>._M_payload._4_1_);
        auVar26[5] = -(cStack_1a3 ==
                      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                      super__Optional_payload_base<ktx::SampleType>._M_payload._5_1_);
        auVar26[6] = -(cStack_1a2 ==
                      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                      super__Optional_payload_base<ktx::SampleType>._M_payload._6_1_);
        auVar26[7] = -(cStack_1a1 ==
                      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                      super__Optional_payload_base<ktx::SampleType>._M_payload._7_1_);
        auVar26[8] = -(cStack_1a0 ==
                      (undefined1)
                      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                      super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.lower);
        auVar26[9] = -(cStack_19f ==
                      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                      super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.lower._1_1_)
        ;
        auVar26[10] = -(cStack_19e ==
                       samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                       super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.lower._2_1_
                       );
        auVar26[0xb] = -(cStack_19d ==
                        samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                        super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.lower.
                        _3_1_);
        auVar26[0xc] = -(cStack_19c ==
                        (undefined1)
                        samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                        super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.upper);
        auVar26[0xd] = -(cStack_19b ==
                        samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                        super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.upper.
                        _1_1_);
        auVar26[0xe] = -(cStack_19a ==
                        samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                        super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.upper.
                        _2_1_);
        auVar26[0xf] = -(cStack_199 ==
                        samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                        super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.upper.
                        _3_1_);
        local_a8 = (ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                           (ushort)(auVar26[0xf] >> 7) << 0xf) != 0xffff;
      }
      local_d0._0_8_ =
           samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
           super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_;
      _Stack_c7._0_7_ =
           (undefined7)
           ((ulong)samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                   super__Optional_payload_base<ktx::SampleType>._M_payload._8_8_ >> 8);
      uStack_bf = SUB41(uVar10,1);
      uStack_be = SUB41(uVar10,2);
      uStack_bd = SUB41(uVar10,3);
      _Stack_bc._M_value._M_elems[0] =
           CONCAT13(local_1a8._M_value._3_1_,
                    CONCAT12(local_1a8._M_value._2_1_,
                             CONCAT11(local_1a8._M_value._1_1_,local_1a8._M_value._0_1_)));
      _Stack_bc._M_value._M_elems[2] =
           CONCAT13(cStack_19d,CONCAT12(cStack_19e,CONCAT11(cStack_19f,cStack_1a0)));
      _Stack_bc._M_value._M_elems[1] =
           (uint)(CONCAT17(cStack_1a1,
                           CONCAT16(cStack_1a2,
                                    CONCAT15(cStack_1a3,
                                             CONCAT14(cStack_1a4,_Stack_bc._M_value._M_elems[0]))))
                 >> 0x20);
      _Stack_bc._M_value._M_elems[3] =
           (uint)(CONCAT17(cStack_199,
                           CONCAT16(cStack_19a,
                                    CONCAT15(cStack_19b,
                                             CONCAT14(cStack_19c,_Stack_bc._M_value._M_elems[2]))))
                 >> 0x20);
      uStack_ab = local_198[1];
      uStack_aa = local_198[2];
      uStack_a9 = local_198[3];
      local_f8._0_8_ = &PTR_value_abi_cxx11__0025c5f8;
      local_198 = abVar9;
      local_d0[8] = (undefined1)
                    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                    super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.lower;
      PrintDiff::operator<<(diff,(DiffBase<std::array<unsigned_int,_4UL>_> *)local_f8);
      if ((pointer)lengthAndOffset[0].
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._0_8_ != _Var21._M_p) {
        operator_delete((void *)lengthAndOffset[0].
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._0_8_,
                        lengthAndOffset[0].
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._16_8_ + 1);
      }
      if ((this->options).super_OptionsCompare.ignoreBDFDBytesPlane == false) {
        samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
        super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = _Var11._M_p;
        __return_storage_ptr__ = (_Optional_payload_base<unsigned_int>)lengthAndOffset;
        fmt_04.size_ = 2;
        fmt_04.data_ = (char *)0x2a;
        _Var17._M_payload = (_Storage<unsigned_int,_true>)0x2;
        _Var17._M_engaged = false;
        _Var17._5_3_ = 0;
        args_04.field_1.args_ = value1.args_;
        args_04.desc_ = (unsigned_long_long)samples;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)__return_storage_ptr__,
                   (v10 *)"/dataFormatDescriptor/blocks/{}/bytesPlane",fmt_04,args_04);
        local_d0[8] = (bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
                      super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
        if ((bool)local_d0[8]) {
          _Var17 = *(_Optional_payload_base<unsigned_int> *)
                    (bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
                    super__Optional_payload_base<ktx::BDFD>._M_payload._M_value.bytesPlanes._M_elems
          ;
        }
        uStack_bf = bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
                    super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
        if ((bool)uStack_bf) {
          __return_storage_ptr__ =
               *(_Optional_payload_base<unsigned_int> *)
                bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
                super__Optional_payload_base<ktx::BDFD>._M_payload._M_value.bytesPlanes._M_elems;
        }
        aStack_e8._M_allocated_capacity = (size_type)"Plane bytes";
        local_f8._8_8_ = 0xb;
        aStack_e8._8_8_ =
             lengthAndOffset[0].
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload._M_value._M_string_length;
        local_d8._M_p =
             (pointer)lengthAndOffset[0].
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._0_8_;
        bVar24 = _Var17 != __return_storage_ptr__;
        if (!(bool)local_d0[8]) {
          bVar24 = local_d0[8] != uStack_bf;
        }
        value1._1_7_ = 0;
        value1._0_1_ = bVar24;
        uStack_be = local_d0[8] != uStack_bf | bVar24;
        _Stack_c7._0_7_ = __return_storage_ptr__._0_7_;
        _Stack_c7._M_value._M_elems[7] = __return_storage_ptr__._7_1_;
        local_f8._0_8_ = &PTR_value_abi_cxx11__0025c638;
        local_d0._0_8_ = _Var17;
        PrintDiff::operator<<(diff,(DiffBase<std::array<unsigned_char,_8UL>_> *)local_f8);
        if ((pointer)lengthAndOffset[0].
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload._0_8_ != _Var21._M_p) {
          operator_delete((void *)lengthAndOffset[0].
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._0_8_,
                          lengthAndOffset[0].
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._16_8_ + 1);
        }
      }
      local_f8._0_8_ = &aStack_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"Sample <i>:\n","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&diff->context
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._0_8_ != &aStack_e8) {
        operator_delete((void *)local_f8._0_8_,(ulong)(aStack_e8._M_allocated_capacity + 1));
      }
      if ((bdfdSamples->
          super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
          ._M_engaged == true) {
        pcVar13 = (pointer)((long)*(pointer *)
                                   ((long)&(bdfdSamples->
                                           super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
                                           )._M_payload.
                                           super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
                                           .
                                           super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                           ._M_payload._M_value.
                                           super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>
                                           ._M_impl + 8) -
                            *(long *)&(bdfdSamples->
                                      super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
                                      )._M_payload.
                                      super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                      ._M_payload._M_value.
                                      super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>
                                      ._M_impl >> 4);
      }
      else {
        pcVar13 = (pointer)0x0;
      }
      if (bdfdSamples[1].
          super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
          ._M_engaged == true) {
        local_38 = (pointer)((long)*(pointer *)
                                    ((long)&bdfdSamples[1].
                                            super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                            ._M_payload._M_value.
                                            super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>
                                            ._M_impl + 8) -
                             *(long *)&bdfdSamples[1].
                                       super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
                                       ._M_payload.
                                       super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
                                       .
                                       super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                       ._M_payload._M_value.
                                       super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>
                                       ._M_impl >> 4);
      }
      else {
        local_38 = (pointer)0x0;
      }
      if (local_38 < pcVar13) {
        local_38 = pcVar13;
      }
      if (local_38 != (pointer)0x0) {
        poVar2 = samples + 1;
        _Var21._M_p = (pointer)0x0;
        local_40 = diff;
        do {
          fmt_05.size_ = 4;
          fmt_05.data_ = (char *)0xb;
          args_05.field_1.values_ = value1.values_;
          args_05.desc_ = (unsigned_long_long)lengthAndOffset;
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._0_8_ = _Var21._M_p;
          ::fmt::v10::vformat_abi_cxx11_((string *)local_f8,(v10 *)"Sample {}:\n",fmt_05,args_05);
          PrintDiff::updateContext(diff,(string *)local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._0_8_ != &aStack_e8) {
            operator_delete((void *)local_f8._0_8_,(ulong)(aStack_e8._M_allocated_capacity + 1));
          }
          samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
          super__Optional_payload_base<ktx::SampleType>._16_4_ =
               samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._16_4_ & 0xffffff00;
          samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
          super__Optional_payload_base<ktx::SampleType>._M_engaged = false;
          lVar20 = 0;
          poVar14 = samples;
          bVar24 = true;
          do {
            bVar25 = bVar24;
            if ((bdfdSamples[lVar20].
                 super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                 ._M_engaged == true) &&
               (lVar4 = *(long *)&bdfdSamples[lVar20].
                                  super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                  ._M_payload._M_value.
                                  super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>
                                  ._M_impl,
               _Var21._M_p <
               (pointer)((long)*(pointer *)
                                ((long)&bdfdSamples[lVar20].
                                        super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                        ._M_payload._M_value.
                                        super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>
                                        ._M_impl + 8) - lVar4 >> 4))) {
              puVar1 = (undefined8 *)(lVar4 + (long)_Var21._M_p * 0x10);
              uVar3 = puVar1[1];
              *(undefined8 *)
               &(poVar14->super__Optional_base<ktx::SampleType,_true,_true>)._M_payload.
                super__Optional_payload_base<ktx::SampleType>._M_payload = *puVar1;
              *(undefined8 *)
               ((long)&(poVar14->super__Optional_base<ktx::SampleType,_true,_true>)._M_payload.
                       super__Optional_payload_base<ktx::SampleType>._M_payload + 8) = uVar3;
              if ((poVar14->super__Optional_base<ktx::SampleType,_true,_true>)._M_payload.
                  super__Optional_payload_base<ktx::SampleType>._M_engaged == false) {
                (poVar14->super__Optional_base<ktx::SampleType,_true,_true>)._M_payload.
                super__Optional_payload_base<ktx::SampleType>._M_engaged = true;
              }
            }
            lVar20 = 1;
            poVar14 = poVar2;
            bVar24 = false;
          } while (bVar25);
          qualifierFlags[0].super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._4_4_ =
               qualifierFlags[0].super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._4_4_ & 0xffffff00;
          qualifierFlags[1].super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._4_4_ =
               qualifierFlags[1].super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._4_4_ & 0xffffff00;
          poVar18 = qualifierFlags;
          poVar14 = samples;
          bVar24 = true;
          do {
            bVar25 = bVar24;
            if ((poVar14->super__Optional_base<ktx::SampleType,_true,_true>)._M_payload.
                super__Optional_payload_base<ktx::SampleType>._M_engaged == true) {
              (poVar18->super__Optional_base<unsigned_int,_true,_true>)._M_payload.
              super__Optional_payload_base<unsigned_int> =
                   (_Optional_payload_base<unsigned_int>)
                   ((ulong)(*(byte *)((long)&(poVar14->
                                             super__Optional_base<ktx::SampleType,_true,_true>).
                                             _M_payload.
                                             super__Optional_payload_base<ktx::SampleType>.
                                             _M_payload + 3) & 0xfffffff0) | 0x100000000);
            }
            poVar18 = qualifierFlags + 1;
            poVar14 = poVar2;
            bVar24 = false;
          } while (bVar25);
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = local_100._M_p;
          fmt_06.size_ = 0x42;
          fmt_06.data_ = (char *)0x35;
          args_06.field_1.values_ = value1.values_;
          args_06.desc_ = (unsigned_long_long)lengthAndOffset;
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ = _Var21._M_p;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&local_1a8,
                     (v10 *)"/dataFormatDescriptor/blocks/{}/samples/{}/qualifiers",fmt_06,args_06);
          local_d8._M_p =
               (pointer)CONCAT17(cStack_1a1,
                                 CONCAT16(cStack_1a2,
                                          CONCAT15(cStack_1a3,
                                                   CONCAT14(cStack_1a4,
                                                            CONCAT13(local_1a8._M_value._3_1_,
                                                                     CONCAT12(local_1a8._M_value.
                                                                              _2_1_,CONCAT11(
                                                  local_1a8._M_value._1_1_,local_1a8._M_value._0_1_)
                                                  ))))));
          aStack_e8._8_8_ =
               CONCAT17(cStack_199,
                        CONCAT16(cStack_19a,
                                 CONCAT15(cStack_19b,
                                          CONCAT14(cStack_19c,
                                                   CONCAT13(cStack_19d,
                                                            CONCAT12(cStack_19e,
                                                                     CONCAT11(cStack_19f,cStack_1a0)
                                                                    ))))));
          aStack_e8._M_allocated_capacity = (size_type)"    Qualifiers";
          local_f8._8_8_ = 0xe;
          _Stack_c7._M_value._M_elems[7] =
               qualifierFlags[0].super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_engaged !=
               qualifierFlags[1].super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_engaged;
          if ((~qualifierFlags[0].super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_engaged & 1U) == 0 &&
              !(bool)_Stack_c7._M_value._M_elems[7]) {
            _Stack_c7._M_value._M_elems[7] =
                 qualifierFlags[0].super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._M_payload._M_value !=
                 qualifierFlags[1].super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._M_payload._M_value;
          }
          local_d0[4] = qualifierFlags[0].super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int>._M_engaged;
          local_d0._5_3_ =
               qualifierFlags[0].super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._5_3_;
          local_d0._0_4_ =
               qualifierFlags[0].super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload._M_value;
          local_d0[8] = (undefined1)
                        qualifierFlags[1].super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int>._M_payload._M_value;
          _Stack_c7._0_7_ =
               (undefined7)
               (CONCAT44(qualifierFlags[1].super__Optional_base<unsigned_int,_true,_true>._M_payload
                         .super__Optional_payload_base<unsigned_int>._4_4_,
                         qualifierFlags[1].super__Optional_base<unsigned_int,_true,_true>._M_payload
                         .super__Optional_payload_base<unsigned_int>._M_payload._M_value) >> 8);
          local_f8._0_8_ = &PTR_value_abi_cxx11__0025bd28;
          _Stack_bc._M_value._M_elems[1] = 0x2631d0;
          _Stack_bc._M_value._M_elems[2] = 0;
          PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_f8);
          pbVar15 = (bool *)CONCAT17(cStack_1a1,
                                     CONCAT16(cStack_1a2,
                                              CONCAT15(cStack_1a3,
                                                       CONCAT14(cStack_1a4,
                                                                CONCAT13(local_1a8._M_value._3_1_,
                                                                         CONCAT12(local_1a8._M_value
                                                                                  ._2_1_,CONCAT11(
                                                  local_1a8._M_value._1_1_,local_1a8._M_value._0_1_)
                                                  ))))));
          if (pbVar15 != local_198) {
            operator_delete(pbVar15,CONCAT44(uStack_194,local_198) + 1);
          }
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = local_100._M_p;
          fmt_07.size_ = 0x42;
          fmt_07.data_ = (char *)0x36;
          args_07.field_1.values_ = value1.values_;
          args_07.desc_ = (unsigned_long_long)lengthAndOffset;
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ = _Var21._M_p;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&local_1a8,
                     (v10 *)"/dataFormatDescriptor/blocks/{}/samples/{}/channelType",fmt_07,args_07)
          ;
          jsonPathIn_02._M_str._1_1_ = local_1a8._M_value._1_1_;
          jsonPathIn_02._M_str._0_1_ = local_1a8._M_value._0_1_;
          jsonPathIn_02._M_str._2_1_ = local_1a8._M_value._2_1_;
          jsonPathIn_02._M_str._3_1_ = local_1a8._M_value._3_1_;
          jsonPathIn_02._M_str._4_1_ = cStack_1a4;
          jsonPathIn_02._M_str._5_1_ = cStack_1a3;
          jsonPathIn_02._M_str._6_1_ = cStack_1a2;
          jsonPathIn_02._M_str._7_1_ = cStack_1a1;
          jsonPathIn_02._M_len._1_1_ = cStack_19f;
          jsonPathIn_02._M_len._0_1_ = cStack_1a0;
          jsonPathIn_02._M_len._2_1_ = cStack_19e;
          jsonPathIn_02._M_len._3_1_ = cStack_19d;
          jsonPathIn_02._M_len._4_1_ = cStack_19c;
          jsonPathIn_02._M_len._5_1_ = cStack_19b;
          jsonPathIn_02._M_len._6_1_ = cStack_19a;
          jsonPathIn_02._M_len._7_1_ = cStack_199;
          cStack_98 = samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                      super__Optional_payload_base<ktx::SampleType>._M_engaged == true;
          if ((bool)cStack_98) {
            local_9c._M_value._0_1_ =
                 samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                 super__Optional_payload_base<ktx::SampleType>._M_payload._3_1_ & 0xf;
            local_9c._M_value._1_1_ = '\0';
            local_9c._M_value._2_1_ = '\0';
            local_9c._M_value._3_1_ = '\0';
          }
          local_44 = samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                     super__Optional_payload_base<ktx::SampleType>._M_engaged == true;
          if ((bool)local_44) {
            local_48._M_value =
                 (byte)samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                       super__Optional_payload_base<ktx::SampleType>._M_payload._3_1_ & 0xf;
          }
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._0_8_ = &bdfds_local;
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._8_8_ = samples;
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._24_8_ =
               std::
               _Function_handler<const_char_*(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp:1745:13)>
               ::_M_invoke;
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ =
               std::
               _Function_handler<const_char_*(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp:1745:13)>
               ::_M_manager;
          value1.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_9c;
          textHeaderIn_02._M_str = "    Channel Type";
          textHeaderIn_02._M_len = 0x10;
          DiffEnum<_khr_df_model_channels_e>::DiffEnum
                    ((DiffEnum<_khr_df_model_channels_e> *)local_f8,textHeaderIn_02,jsonPathIn_02,
                     (optional<int> *)value1.values_,(optional<int> *)&local_48,
                     (function<const_char_*(unsigned_long)> *)lengthAndOffset);
          uStack_bf = true;
          PrintDiff::operator<<(diff,(DiffBase<_khr_df_model_channels_e> *)local_f8);
          if (lengthAndOffset[0].
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._16_8_ != 0) {
            (*(code *)lengthAndOffset[0].
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_)(lengthAndOffset,lengthAndOffset,3);
          }
          pbVar15 = (bool *)CONCAT17(cStack_1a1,
                                     CONCAT16(cStack_1a2,
                                              CONCAT15(cStack_1a3,
                                                       CONCAT14(cStack_1a4,
                                                                CONCAT13(local_1a8._M_value._3_1_,
                                                                         CONCAT12(local_1a8._M_value
                                                                                  ._2_1_,CONCAT11(
                                                  local_1a8._M_value._1_1_,local_1a8._M_value._0_1_)
                                                  ))))));
          if (pbVar15 != local_198) {
            operator_delete(pbVar15,CONCAT44(uStack_194,local_198) + 1);
          }
          if ((this->options).super_OptionsFormat.format == text) {
            lengthAndOffset[0].
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged = false;
            lengthAndOffset[1].
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged = false;
            this_00 = (optional<std::__cxx11::string> *)lengthAndOffset;
            poVar14 = samples;
            bVar24 = true;
            do {
              bVar25 = bVar24;
              if ((poVar14->super__Optional_base<ktx::SampleType,_true,_true>)._M_payload.
                  super__Optional_payload_base<ktx::SampleType>._M_engaged == true) {
                uVar5 = *(ulong *)&(poVar14->super__Optional_base<ktx::SampleType,_true,_true>).
                                   _M_payload.super__Optional_payload_base<ktx::SampleType>.
                                   _M_payload;
                local_f8._0_8_ = (uVar5 >> 0x10 & 0xff) + 1;
                aStack_e8._M_allocated_capacity = (size_type)(char *)(uVar5 & 0xffff);
                fmt_10.size_ = 0x22;
                fmt_10.data_ = (char *)0x1e;
                args_10.field_1.values_ = value1.values_;
                args_10.desc_ = (unsigned_long_long)local_f8;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)&local_1a8,(v10 *)"    Length: {} bits Offset: {}",fmt_10,
                           args_10);
                std::optional<std::__cxx11::string>::operator=
                          (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_1a8);
                pbVar15 = (bool *)CONCAT17(cStack_1a1,
                                           CONCAT16(cStack_1a2,
                                                    CONCAT15(cStack_1a3,
                                                             CONCAT14(cStack_1a4,
                                                                      CONCAT13(local_1a8._M_value.
                                                                               _3_1_,CONCAT12(
                                                  local_1a8._M_value._2_1_,
                                                  CONCAT11(local_1a8._M_value._1_1_,
                                                           local_1a8._M_value._0_1_)))))));
                if (pbVar15 != local_198) {
                  operator_delete(pbVar15,CONCAT44(uStack_194,local_198) + 1);
                }
              }
              this_00 = (optional<std::__cxx11::string> *)(lengthAndOffset + 1);
              poVar14 = poVar2;
              bVar24 = false;
            } while (bVar25);
            DiffTextCustom::DiffTextCustom
                      ((DiffTextCustom *)local_f8,lengthAndOffset,lengthAndOffset + 1);
            diff = local_40;
            PrintDiff::operator<<(local_40,(DiffTextCustom *)local_f8);
            lVar20 = 0x50;
            do {
              if (*(char *)((long)&local_100._M_p + lVar20) == '\x01') {
                pbVar15 = &lengthAndOffset[1].
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_engaged + lVar20;
                *(undefined1 *)((long)&local_100._M_p + lVar20) = 0;
                plVar6 = *(long **)((long)&lengthAndOffset[1].
                                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                           ._M_payload.
                                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                           .
                                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           ._M_payload + lVar20 + 0x10);
                if (pbVar15 != (bool *)plVar6) {
                  operator_delete(plVar6,*(long *)pbVar15 + 1);
                }
              }
              lVar20 = lVar20 + -0x28;
            } while (lVar20 != 0);
            lVar20 = 0;
            do {
              if ((&lengthAndOffset[1].
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_engaged)[lVar20] == true) {
                (&lengthAndOffset[1].
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_engaged)[lVar20] = false;
                pvVar7 = *(void **)((long)&lengthAndOffset[1].
                                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                           ._M_payload.
                                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                           .
                                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           ._M_payload + lVar20);
                if ((void *)((long)&lengthAndOffset[1].
                                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._M_payload + lVar20 + 0x10) != pvVar7) {
                  operator_delete(pvVar7,*(long *)((long)&lengthAndOffset[1].
                                                                                                                    
                                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ._M_payload + lVar20 + 0x10) + 1);
                }
              }
              lVar20 = lVar20 + -0x28;
            } while (lVar20 != -0x50);
          }
          else {
            lengthAndOffset[0].
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = local_100._M_p;
            fmt_08.size_ = 0x42;
            fmt_08.data_ = (char *)0x34;
            args_08.field_1.values_ = value1.values_;
            args_08.desc_ = (unsigned_long_long)lengthAndOffset;
            lengthAndOffset[0].
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._16_8_ = _Var21._M_p;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)&local_1a8,
                       (v10 *)"/dataFormatDescriptor/blocks/{}/samples/{}/bitLength",fmt_08,args_08)
            ;
            local_d8._M_p =
                 (pointer)CONCAT17(cStack_1a1,
                                   CONCAT16(cStack_1a2,
                                            CONCAT15(cStack_1a3,
                                                     CONCAT14(cStack_1a4,
                                                              CONCAT13(local_1a8._M_value._3_1_,
                                                                       CONCAT12(local_1a8._M_value.
                                                                                _2_1_,CONCAT11(
                                                  local_1a8._M_value._1_1_,local_1a8._M_value._0_1_)
                                                  ))))));
            aStack_e8._8_8_ =
                 CONCAT17(cStack_199,
                          CONCAT16(cStack_19a,
                                   CONCAT15(cStack_19b,
                                            CONCAT14(cStack_19c,
                                                     CONCAT13(cStack_19d,
                                                              CONCAT12(cStack_19e,
                                                                       CONCAT11(cStack_19f,
                                                                                cStack_1a0)))))));
            if ((samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                 super__Optional_payload_base<ktx::SampleType>._16_4_ & 1) != 0) {
              local_5c = (uint)(byte)samples[0].super__Optional_base<ktx::SampleType,_true,_true>.
                                     _M_payload.super__Optional_payload_base<ktx::SampleType>.
                                     _M_payload._2_1_;
            }
            if (samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                super__Optional_payload_base<ktx::SampleType>._M_engaged != false) {
              local_60 = (uint)(byte)samples[1].super__Optional_base<ktx::SampleType,_true,_true>.
                                     _M_payload.super__Optional_payload_base<ktx::SampleType>.
                                     _M_payload._2_1_;
            }
            aVar23._4_4_ = 0;
            aVar23._0_4_ = local_60;
            local_f8._8_8_ = 0;
            aStack_e8._M_allocated_capacity = (size_type)(char *)0x0;
            _Stack_c7._M_value._M_elems[7] =
                 local_5c != local_60 &
                 samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                 super__Optional_payload_base<ktx::SampleType>._M_engaged |
                 samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                 super__Optional_payload_base<ktx::SampleType>._M_engaged !=
                 samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                 super__Optional_payload_base<ktx::SampleType>._M_engaged;
            local_d0[4] = samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                          super__Optional_payload_base<ktx::SampleType>._M_engaged;
            local_d0._0_4_ = local_5c;
            local_d0._5_3_ = 0;
            local_d0[8] = (undefined1)local_60;
            _Stack_c7._4_3_ = 0;
            _Stack_c7._0_4_ =
                 (uint)(CONCAT14(samples[1].super__Optional_base<ktx::SampleType,_true,_true>.
                                 _M_payload.super__Optional_payload_base<ktx::SampleType>._M_engaged
                                 ,local_60) >> 8);
            local_f8._0_8_ = &PTR_value_abi_cxx11__0025c4f8;
            PrintDiff::operator<<(diff,(DiffBase<int> *)local_f8);
            pbVar15 = (bool *)CONCAT17(cStack_1a1,
                                       CONCAT16(cStack_1a2,
                                                CONCAT15(cStack_1a3,
                                                         CONCAT14(cStack_1a4,
                                                                  CONCAT13(local_1a8._M_value._3_1_,
                                                                           CONCAT12(local_1a8.
                                                                                    _M_value._2_1_,
                                                                                    CONCAT11(
                                                  local_1a8._M_value._1_1_,local_1a8._M_value._0_1_)
                                                  ))))));
            if (pbVar15 != local_198) {
              operator_delete(pbVar15,CONCAT44(uStack_194,local_198) + 1);
            }
            lengthAndOffset[0].
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = local_100._M_p;
            fmt_09.size_ = 0x42;
            fmt_09.data_ = (char *)0x34;
            args_09.field_1.args_ = aVar23.args_;
            args_09.desc_ = (unsigned_long_long)lengthAndOffset;
            lengthAndOffset[0].
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._16_8_ = _Var21._M_p;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)&local_1a8,
                       (v10 *)"/dataFormatDescriptor/blocks/{}/samples/{}/bitOffset",fmt_09,args_09)
            ;
            local_d8._M_p =
                 (pointer)CONCAT17(cStack_1a1,
                                   CONCAT16(cStack_1a2,
                                            CONCAT15(cStack_1a3,
                                                     CONCAT14(cStack_1a4,
                                                              CONCAT13(local_1a8._M_value._3_1_,
                                                                       CONCAT12(local_1a8._M_value.
                                                                                _2_1_,CONCAT11(
                                                  local_1a8._M_value._1_1_,local_1a8._M_value._0_1_)
                                                  ))))));
            aStack_e8._8_8_ =
                 CONCAT17(cStack_199,
                          CONCAT16(cStack_19a,
                                   CONCAT15(cStack_19b,
                                            CONCAT14(cStack_19c,
                                                     CONCAT13(cStack_19d,
                                                              CONCAT12(cStack_19e,
                                                                       CONCAT11(cStack_19f,
                                                                                cStack_1a0)))))));
            if ((samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                 super__Optional_payload_base<ktx::SampleType>._16_4_ & 1) != 0) {
              local_64 = (uint)(ushort)samples[0].super__Optional_base<ktx::SampleType,_true,_true>.
                                       _M_payload.super__Optional_payload_base<ktx::SampleType>.
                                       _M_payload._0_2_;
            }
            if (samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                super__Optional_payload_base<ktx::SampleType>._M_engaged != false) {
              local_68 = (uint)(ushort)samples[1].super__Optional_base<ktx::SampleType,_true,_true>.
                                       _M_payload.super__Optional_payload_base<ktx::SampleType>.
                                       _M_payload._0_2_;
            }
            value1._4_4_ = 0;
            value1._0_4_ = local_68;
            local_f8._8_8_ = 0;
            aStack_e8._M_allocated_capacity = (size_type)(char *)0x0;
            _Stack_c7._M_value._M_elems[7] =
                 local_64 != local_68 &
                 samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                 super__Optional_payload_base<ktx::SampleType>._M_engaged |
                 samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                 super__Optional_payload_base<ktx::SampleType>._M_engaged !=
                 samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                 super__Optional_payload_base<ktx::SampleType>._M_engaged;
            local_d0[4] = samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                          super__Optional_payload_base<ktx::SampleType>._M_engaged;
            local_d0._0_4_ = local_64;
            local_d0._5_3_ = 0;
            local_d0[8] = (undefined1)local_68;
            _Stack_c7._4_3_ = 0;
            _Stack_c7._0_4_ =
                 (uint)(CONCAT14(samples[1].super__Optional_base<ktx::SampleType,_true,_true>.
                                 _M_payload.super__Optional_payload_base<ktx::SampleType>._M_engaged
                                 ,local_68) >> 8);
            local_f8._0_8_ = &PTR_value_abi_cxx11__0025c4f8;
            PrintDiff::operator<<(diff,(DiffBase<int> *)local_f8);
            pbVar15 = (bool *)CONCAT17(cStack_1a1,
                                       CONCAT16(cStack_1a2,
                                                CONCAT15(cStack_1a3,
                                                         CONCAT14(cStack_1a4,
                                                                  CONCAT13(local_1a8._M_value._3_1_,
                                                                           CONCAT12(local_1a8.
                                                                                    _M_value._2_1_,
                                                                                    CONCAT11(
                                                  local_1a8._M_value._1_1_,local_1a8._M_value._0_1_)
                                                  ))))));
            if (pbVar15 != local_198) {
              operator_delete(pbVar15,CONCAT44(uStack_194,local_198) + 1);
            }
          }
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = local_100._M_p;
          fmt_11.size_ = 0x42;
          fmt_11.data_ = (char *)0x39;
          args_11.field_1.args_ = value1.args_;
          args_11.desc_ = (unsigned_long_long)lengthAndOffset;
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ = _Var21._M_p;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&local_1a8,
                     (v10 *)"/dataFormatDescriptor/blocks/{}/samples/{}/samplePosition",fmt_11,
                     args_11);
          uVar3 = lengthAndOffset[0].
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._16_8_;
          local_d8._M_p =
               (pointer)CONCAT17(cStack_1a1,
                                 CONCAT16(cStack_1a2,
                                          CONCAT15(cStack_1a3,
                                                   CONCAT14(cStack_1a4,
                                                            CONCAT13(local_1a8._M_value._3_1_,
                                                                     CONCAT12(local_1a8._M_value.
                                                                              _2_1_,CONCAT11(
                                                  local_1a8._M_value._1_1_,local_1a8._M_value._0_1_)
                                                  ))))));
          aStack_e8._8_8_ =
               CONCAT17(cStack_199,
                        CONCAT16(cStack_19a,
                                 CONCAT15(cStack_19b,
                                          CONCAT14(cStack_19c,
                                                   CONCAT13(cStack_19d,
                                                            CONCAT12(cStack_19e,
                                                                     CONCAT11(cStack_19f,cStack_1a0)
                                                                    ))))));
          _Stack_c7._M_value._M_elems[7] =
               samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_engaged == true;
          if ((bool)_Stack_c7._M_value._M_elems[7]) {
            value1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                      )0xff;
            uVar16 = (uint)((ulong)samples[0].super__Optional_base<ktx::SampleType,_true,_true>.
                                   _M_payload.super__Optional_payload_base<ktx::SampleType>.
                                   _M_payload._0_8_ >> 0x20);
            lengthAndOffset[0].
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = CONCAT44(uVar16 >> 8,uVar16) & 0xff000000ff;
            lengthAndOffset[0].
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_string_length._5_3_ = 0;
            lengthAndOffset[0].
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_string_length._0_5_ =
                 CONCAT14((char)((ulong)samples[0].super__Optional_base<ktx::SampleType,_true,_true>
                                        ._M_payload.super__Optional_payload_base<ktx::SampleType>.
                                        _M_payload._0_8_ >> 0x38),
                          (uint)(ushort)((ulong)samples[0].
                                                super__Optional_base<ktx::SampleType,_true,_true>.
                                                _M_payload.
                                                super__Optional_payload_base<ktx::SampleType>.
                                                _M_payload._0_8_ >> 0x30)) & 0xff000000ff;
          }
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_1_ = _Stack_c7._M_value._M_elems[7];
          local_ac = samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                     super__Optional_payload_base<ktx::SampleType>._M_engaged == true;
          if (local_ac) {
            value1._0_4_ = (uint)samples[1].super__Optional_base<ktx::SampleType,_true,_true>.
                                 _M_payload.super__Optional_payload_base<ktx::SampleType>._M_payload
                                 ._4_4_ >> 0x10 & 0xff;
            value1._4_4_ = 0;
            local_9c._M_value._0_1_ =
                 (undefined1)
                 samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                 super__Optional_payload_base<ktx::SampleType>._M_payload._4_4_;
            local_9c._M_value._1_1_ = '\0';
            local_9c._M_value._2_1_ = '\0';
            local_9c._M_value._3_1_ = '\0';
            cStack_98 = (char)((uint)samples[1].super__Optional_base<ktx::SampleType,_true,_true>.
                                     _M_payload.super__Optional_payload_base<ktx::SampleType>.
                                     _M_payload._4_4_ >> 8);
            cStack_97 = '\0';
            cStack_96 = '\0';
            cStack_95 = '\0';
            cStack_94 = (char)((uint)samples[1].super__Optional_base<ktx::SampleType,_true,_true>.
                                     _M_payload.super__Optional_payload_base<ktx::SampleType>.
                                     _M_payload._4_4_ >> 0x10);
            cStack_93 = '\0';
            cStack_92 = '\0';
            cStack_91 = '\0';
            cStack_90 = (char)((uint)samples[1].super__Optional_base<ktx::SampleType,_true,_true>.
                                     _M_payload.super__Optional_payload_base<ktx::SampleType>.
                                     _M_payload._4_4_ >> 0x18);
            cStack_8f = '\0';
            cStack_8e = '\0';
            cStack_8d = '\0';
          }
          local_8c = local_ac;
          aStack_e8._M_allocated_capacity = (size_type)"    Position";
          local_f8._8_8_ = 0xc;
          local_a8 = (bool)_Stack_c7._M_value._M_elems[7] != local_ac;
          if ((bool)_Stack_c7._M_value._M_elems[7] && !local_a8) {
            auVar27[0] = -(local_9c._M_value._0_1_ ==
                          lengthAndOffset[0].
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._0_1_);
            auVar27[1] = -(local_9c._M_value._1_1_ ==
                          lengthAndOffset[0].
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._1_1_);
            auVar27[2] = -(local_9c._M_value._2_1_ ==
                          lengthAndOffset[0].
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._2_1_);
            auVar27[3] = -(local_9c._M_value._3_1_ ==
                          lengthAndOffset[0].
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._3_1_);
            auVar27[4] = -(cStack_98 ==
                          lengthAndOffset[0].
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._4_1_);
            auVar27[5] = -(cStack_97 ==
                          lengthAndOffset[0].
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._5_1_);
            auVar27[6] = -(cStack_96 ==
                          lengthAndOffset[0].
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._6_1_);
            auVar27[7] = -(cStack_95 ==
                          lengthAndOffset[0].
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._7_1_);
            auVar27[8] = -(cStack_94 ==
                          (undefined1)
                          lengthAndOffset[0].
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._M_value._M_string_length);
            auVar27[9] = -(cStack_93 ==
                          lengthAndOffset[0].
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._M_value._M_string_length._1_1_);
            auVar27[10] = -(cStack_92 ==
                           lengthAndOffset[0].
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload._M_value._M_string_length._2_1_);
            auVar27[0xb] = -(cStack_91 ==
                            lengthAndOffset[0].
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_string_length._3_1_);
            auVar27[0xc] = -(cStack_90 ==
                            lengthAndOffset[0].
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_string_length._4_1_);
            auVar27[0xd] = -(cStack_8f ==
                            lengthAndOffset[0].
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_string_length._5_1_);
            auVar27[0xe] = -(cStack_8e ==
                            lengthAndOffset[0].
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_string_length._6_1_);
            auVar27[0xf] = -(cStack_8d ==
                            lengthAndOffset[0].
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_string_length._7_1_);
            local_a8 = (ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                               (ushort)(auVar27[0xf] >> 7) << 0xf) != 0xffff;
          }
          uStack_bf = (undefined1)((ulong)uVar3 >> 8);
          uStack_be = (undefined1)((ulong)uVar3 >> 0x10);
          uStack_bd = (undefined1)((ulong)uVar3 >> 0x18);
          local_d0._0_8_ =
               lengthAndOffset[0].
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._M_value._M_dataplus._M_p;
          _Stack_c7._0_7_ =
               (undefined7)
               ((ulong)lengthAndOffset[0].
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload._8_8_ >> 8);
          _uStack_ab = uStack_8b;
          _Stack_bc._M_value._M_elems[0] =
               CONCAT13(local_9c._M_value._3_1_,
                        CONCAT12(local_9c._M_value._2_1_,
                                 CONCAT11(local_9c._M_value._1_1_,local_9c._M_value._0_1_)));
          _Stack_bc._M_value._M_elems[2] =
               CONCAT13(cStack_91,CONCAT12(cStack_92,CONCAT11(cStack_93,cStack_94)));
          _Stack_bc._M_value._M_elems[1] =
               (uint)(CONCAT17(cStack_95,
                               CONCAT16(cStack_96,
                                        CONCAT15(cStack_97,
                                                 CONCAT14(cStack_98,_Stack_bc._M_value._M_elems[0]))
                                       )) >> 0x20);
          _Stack_bc._M_value._M_elems[3] =
               (uint)(CONCAT17(cStack_8d,
                               CONCAT16(cStack_8e,
                                        CONCAT15(cStack_8f,
                                                 CONCAT14(cStack_90,_Stack_bc._M_value._M_elems[2]))
                                       )) >> 0x20);
          local_f8._0_8_ = &PTR_value_abi_cxx11__0025c5f8;
          local_d0[8] = (undefined1)
                        lengthAndOffset[0].
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_string_length;
          PrintDiff::operator<<(diff,(DiffBase<std::array<unsigned_int,_4UL>_> *)local_f8);
          pbVar15 = (bool *)CONCAT17(cStack_1a1,
                                     CONCAT16(cStack_1a2,
                                              CONCAT15(cStack_1a3,
                                                       CONCAT14(cStack_1a4,
                                                                CONCAT13(local_1a8._M_value._3_1_,
                                                                         CONCAT12(local_1a8._M_value
                                                                                  ._2_1_,CONCAT11(
                                                  local_1a8._M_value._1_1_,local_1a8._M_value._0_1_)
                                                  ))))));
          if (pbVar15 != local_198) {
            operator_delete(pbVar15,CONCAT44(uStack_194,local_198) + 1);
          }
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = local_100._M_p;
          fmt_12.size_ = 0x42;
          fmt_12.data_ = (char *)0x36;
          args_12.field_1.values_ = value1.values_;
          args_12.desc_ = (unsigned_long_long)lengthAndOffset;
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ = _Var21._M_p;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&local_1a8,
                     (v10 *)"/dataFormatDescriptor/blocks/{}/samples/{}/sampleLower",fmt_12,args_12)
          ;
          local_d8._M_p =
               (pointer)CONCAT17(cStack_1a1,
                                 CONCAT16(cStack_1a2,
                                          CONCAT15(cStack_1a3,
                                                   CONCAT14(cStack_1a4,
                                                            CONCAT13(local_1a8._M_value._3_1_,
                                                                     CONCAT12(local_1a8._M_value.
                                                                              _2_1_,CONCAT11(
                                                  local_1a8._M_value._1_1_,local_1a8._M_value._0_1_)
                                                  ))))));
          aStack_e8._8_8_ =
               CONCAT17(cStack_199,
                        CONCAT16(cStack_19a,
                                 CONCAT15(cStack_19b,
                                          CONCAT14(cStack_19c,
                                                   CONCAT13(cStack_19d,
                                                            CONCAT12(cStack_19e,
                                                                     CONCAT11(cStack_19f,cStack_1a0)
                                                                    ))))));
          if ((samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._16_4_ & 1) != 0) {
            local_50 = samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                       super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.lower;
          }
          if (samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
              super__Optional_payload_base<ktx::SampleType>._M_engaged != false) {
            local_4c = samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                       super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.lower;
          }
          aStack_e8._M_allocated_capacity = (size_type)"    Lower";
          local_f8._8_8_ = 9;
          _Stack_c7._M_value._M_elems[7] =
               local_50 != local_4c &
               samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_engaged |
               samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_engaged !=
               samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_engaged;
          local_d0[4] = samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                        super__Optional_payload_base<ktx::SampleType>._M_engaged;
          local_d0._0_4_ = local_50;
          local_d0._5_3_ = 0;
          local_d0[8] = (undefined1)local_4c;
          _Stack_c7._4_3_ = 0;
          _Stack_c7._0_4_ =
               (uint)(CONCAT14(samples[1].super__Optional_base<ktx::SampleType,_true,_true>.
                               _M_payload.super__Optional_payload_base<ktx::SampleType>._M_engaged,
                               local_4c) >> 8);
          local_f8._0_8_ = &PTR_value_abi_cxx11__0025c6b8;
          PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_f8);
          pbVar15 = (bool *)CONCAT17(cStack_1a1,
                                     CONCAT16(cStack_1a2,
                                              CONCAT15(cStack_1a3,
                                                       CONCAT14(cStack_1a4,
                                                                CONCAT13(local_1a8._M_value._3_1_,
                                                                         CONCAT12(local_1a8._M_value
                                                                                  ._2_1_,CONCAT11(
                                                  local_1a8._M_value._1_1_,local_1a8._M_value._0_1_)
                                                  ))))));
          if (pbVar15 != local_198) {
            operator_delete(pbVar15,CONCAT44(uStack_194,local_198) + 1);
          }
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = local_100._M_p;
          fmt_13.size_ = 0x42;
          fmt_13.data_ = (char *)0x36;
          args_13.field_1.values_ = value1.values_;
          args_13.desc_ = (unsigned_long_long)lengthAndOffset;
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ = _Var21._M_p;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&local_1a8,
                     (v10 *)"/dataFormatDescriptor/blocks/{}/samples/{}/sampleUpper",fmt_13,args_13)
          ;
          local_d8._M_p =
               (pointer)CONCAT17(cStack_1a1,
                                 CONCAT16(cStack_1a2,
                                          CONCAT15(cStack_1a3,
                                                   CONCAT14(cStack_1a4,
                                                            CONCAT13(local_1a8._M_value._3_1_,
                                                                     CONCAT12(local_1a8._M_value.
                                                                              _2_1_,CONCAT11(
                                                  local_1a8._M_value._1_1_,local_1a8._M_value._0_1_)
                                                  ))))));
          aStack_e8._8_8_ =
               CONCAT17(cStack_199,
                        CONCAT16(cStack_19a,
                                 CONCAT15(cStack_19b,
                                          CONCAT14(cStack_19c,
                                                   CONCAT13(cStack_19d,
                                                            CONCAT12(cStack_19e,
                                                                     CONCAT11(cStack_19f,cStack_1a0)
                                                                    ))))));
          if ((samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._16_4_ & 1) != 0) {
            local_58 = samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                       super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.upper;
          }
          if (samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
              super__Optional_payload_base<ktx::SampleType>._M_engaged != false) {
            local_54 = samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                       super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.upper;
          }
          aStack_e8._M_allocated_capacity = (size_type)"    Upper";
          local_f8._8_8_ = 9;
          _Stack_c7._M_value._M_elems[7] =
               local_58 != local_54 &
               samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_engaged |
               samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_engaged !=
               samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_engaged;
          local_d0[4] = samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                        super__Optional_payload_base<ktx::SampleType>._M_engaged;
          local_d0._0_4_ = local_58;
          local_d0._5_3_ = 0;
          local_d0[8] = (undefined1)local_54;
          _Stack_c7._4_3_ = 0;
          _Stack_c7._0_4_ =
               (uint)(CONCAT14(samples[1].super__Optional_base<ktx::SampleType,_true,_true>.
                               _M_payload.super__Optional_payload_base<ktx::SampleType>._M_engaged,
                               local_54) >> 8);
          local_f8._0_8_ = &PTR_value_abi_cxx11__0025c6b8;
          PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_f8);
          pbVar15 = (bool *)CONCAT17(cStack_1a1,
                                     CONCAT16(cStack_1a2,
                                              CONCAT15(cStack_1a3,
                                                       CONCAT14(cStack_1a4,
                                                                CONCAT13(local_1a8._M_value._3_1_,
                                                                         CONCAT12(local_1a8._M_value
                                                                                  ._2_1_,CONCAT11(
                                                  local_1a8._M_value._1_1_,local_1a8._M_value._0_1_)
                                                  ))))));
          if (pbVar15 != local_198) {
            operator_delete(pbVar15,CONCAT44(uStack_194,local_198) + 1);
          }
          _Var21._M_p = _Var21._M_p + 1;
        } while (_Var21._M_p != local_38);
      }
    }
    return;
  }
  __assert_fail("bdfds[i].has_value() == bdfdSamples[i].has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp"
                ,0x691,
                "void ktx::CommandCompare::compareDFDBasic(PrintDiff &, uint32_t, std::optional<BDFD> *, std::optional<std::vector<SampleType>> *)"
               );
}

Assistant:

void CommandCompare::compareDFDBasic(PrintDiff& diff, uint32_t blockIndex,
    std::optional<BDFD> bdfds[2], std::optional<std::vector<SampleType>> bdfdSamples[2]) {
    for (std::size_t i = 0; i < 2; ++i)
        assert(bdfds[i].has_value() == bdfdSamples[i].has_value());

    if (options.ignoreDFD != IgnoreDFD::all_except_color_space)
        diff << DiffFlags("Flags",
            fmt::format("/dataFormatDescriptor/blocks/{}/flags", blockIndex),
            OPT_BITFIELDS(bdfds, flags), dfdToStringFlagsBit);

    diff << DiffEnum<khr_df_transfer_e>("Transfer",
        fmt::format("/dataFormatDescriptor/blocks/{}/transferFunction", blockIndex),
        OPT_BITFIELDS(bdfds, transfer),
        [&](auto i) { return dfdToStringTransferFunction(khr_df_transfer_e(bdfds[i]->transfer)); });
    diff << DiffEnum<khr_df_primaries_e>("Primaries",
        fmt::format("/dataFormatDescriptor/blocks/{}/colorPrimaries", blockIndex),
        OPT_BITFIELDS(bdfds, primaries),
        [&](auto i) { return dfdToStringColorPrimaries(khr_df_primaries_e(bdfds[i]->primaries)); });

    // Do not compare the remainder of the BDFD if everything but color space information is ignored
    if (options.ignoreDFD == IgnoreDFD::all_except_color_space)
        return;

    diff << DiffEnum<khr_df_model_e>("Model",
        fmt::format("/dataFormatDescriptor/blocks/{}/colorModel", blockIndex),
        OPT_BITFIELDS(bdfds, model),
        [&](auto i) { return dfdToStringColorModel(khr_df_model_e(bdfds[i]->model)); });
    diff << DiffArray("Dimensions",
        fmt::format("/dataFormatDescriptor/blocks/{}/texelBlockDimension", blockIndex),
        OPT_UINT4S(bdfds, texelBlockDimension));

    if (!options.ignoreBDFDBytesPlane)
        diff << DiffArray("Plane bytes",
            fmt::format("/dataFormatDescriptor/blocks/{}/bytesPlane", blockIndex),
            OPT_FIELDS(bdfds, bytesPlanes));

    diff.addContext("Sample <i>:\n");

    std::size_t maxNumSamples = std::max(
        bdfdSamples[0].has_value() ? bdfdSamples[0]->size() : 0,
        bdfdSamples[1].has_value() ? bdfdSamples[1]->size() : 0
    );
    for (std::size_t sampleIndex = 0; sampleIndex < maxNumSamples; ++sampleIndex) {
        diff.updateContext(fmt::format("Sample {}:\n", sampleIndex));

        std::optional<SampleType> samples[2] = {};
        for (std::size_t i = 0; i < 2; ++i)
            if (bdfdSamples[i].has_value() && sampleIndex < bdfdSamples[i]->size())
                samples[i] = (*bdfdSamples[i])[sampleIndex];

        std::optional<uint32_t> qualifierFlags[2] = {};
        for (std::size_t i = 0; i < 2; ++i)
            if (samples[i].has_value()) {
                uint32_t flags = 0;
                flags |= samples[i]->qualifierLinear ? KHR_DF_SAMPLE_DATATYPE_LINEAR : 0;
                flags |= samples[i]->qualifierExponent ? KHR_DF_SAMPLE_DATATYPE_EXPONENT : 0;
                flags |= samples[i]->qualifierSigned ? KHR_DF_SAMPLE_DATATYPE_SIGNED : 0;
                flags |= samples[i]->qualifierFloat ? KHR_DF_SAMPLE_DATATYPE_FLOAT : 0;
                qualifierFlags[i] = flags;
            }
        diff << DiffFlags("    Qualifiers",
            fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/qualifiers", blockIndex, sampleIndex),
            qualifierFlags[0], qualifierFlags[1], dfdToStringSampleDatatypeQualifiersBit);

        diff << DiffEnum<khr_df_model_channels_e>("    Channel Type",
            fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/channelType", blockIndex, sampleIndex),
            OPT_BITFIELDS(samples, channelType),
            [&](auto i) {
                return dfdToStringChannelId(khr_df_model_e(bdfds[i]->model),
                    khr_df_model_channels_e(samples[i]->channelType));
            })
            .outputHexInText();

        // Text output combines length and offset so we have to special-case here
        if (options.format == OutputFormat::text) {
            std::optional<std::string> lengthAndOffset[2] = {};
            for (std::size_t i = 0; i < 2; ++i)
                if (samples[i].has_value())
                    lengthAndOffset[i] = fmt::format("    Length: {} bits Offset: {}",
                        static_cast<uint32_t>(samples[i]->bitLength + 1),
                        static_cast<uint32_t>(samples[i]->bitOffset));
            diff << DiffTextCustom(lengthAndOffset[0], lengthAndOffset[1]);
        } else {
            diff << Diff({},
                fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/bitLength", blockIndex, sampleIndex),
                OPT_BITFIELDS(samples, bitLength));
            diff << Diff({},
                fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/bitOffset", blockIndex, sampleIndex),
                OPT_BITFIELDS(samples, bitOffset));
        }

        diff << DiffArray("    Position",
            fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/samplePosition", blockIndex, sampleIndex),
            OPT_UINT4S(samples, samplePosition));
        diff << DiffHexFixedWidth("    Lower",
            fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/sampleLower", blockIndex, sampleIndex),
            OPT_FIELDS(samples, lower));
        diff << DiffHexFixedWidth("    Upper",
            fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/sampleUpper", blockIndex, sampleIndex),
            OPT_FIELDS(samples, upper));
    }
}